

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O0

istream * amrex::operator>>(istream *is,expect *exp)

{
  undefined8 uVar1;
  int iVar2;
  _Ios_Iostate __b;
  ulong uVar3;
  char *pcVar4;
  expect *in_RSI;
  istream *in_RDI;
  string msg;
  char c;
  int n;
  int len;
  string *__rhs;
  int in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffff90;
  string local_68 [32];
  string local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  char local_21;
  int local_20;
  int local_1c;
  expect *local_18;
  istream *local_10;
  undefined8 local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_1c = std::__cxx11::string::size();
  local_20 = 0;
  do {
    if (local_1c <= local_20) goto LAB_00f4a2ed;
    std::operator>>(local_10,&local_21);
    uVar3 = std::ios::operator!((ios *)(local_10 + *(long *)(*(long *)local_10 + -0x18)));
    if ((uVar3 & 1) != 0) goto LAB_00f4a2ed;
    in_stack_ffffffffffffff88 = (int)local_21;
    local_20 = local_20 + 1;
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
  } while (in_stack_ffffffffffffff88 == *pcVar4);
  std::istream::putback((char)local_10);
LAB_00f4a2ed:
  if (local_20 != local_1c) {
    uVar1 = *(undefined8 *)(*(long *)local_10 + -0x18);
    iVar2 = (int)local_10;
    __b = std::ios::rdstate();
    std::operator|(_S_badbit,__b);
    std::ios::clear(iVar2 + (int)uVar1);
    expect::the_string_abi_cxx11_(local_18);
    __rhs = local_68;
    std::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),(char *)__rhs);
    std::__cxx11::string::~string(local_68);
    local_8 = std::__cxx11::string::c_str();
    Error_host(in_stack_ffffffffffffff90);
    std::__cxx11::string::~string(local_48);
  }
  return local_10;
}

Assistant:

std::istream&
amrex::operator>>(std::istream& is, const expect& exp)
{
    int len = exp.istr.size();
    int n = 0;
    while ( n < len )
    {
        char c;
        is >> c;
        if ( !is ) break;
        if ( c != exp.istr[n++] )
        {
            is.putback(c);
            break;
        }
    }
    if ( n != len )
    {
        is.clear(std::ios::badbit|is.rdstate());
        std::string msg = "expect fails to find \"" + exp.the_string() + "\"";
        amrex::Error(msg.c_str());
    }
    return is;
}